

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

void __thiscall Potassco::TheoryData::resizeAtoms(TheoryData *this,uint32_t newSize)

{
  ulong uVar1;
  uint uVar2;
  Data *this_00;
  TheoryAtom *local_20;
  
  this_00 = this->data_;
  uVar1 = (this_00->atoms).top;
  uVar2 = (uint)(uVar1 >> 3);
  if (uVar2 != newSize) {
    if (uVar2 < newSize) {
      do {
        local_20 = (TheoryAtom *)0x0;
        Data::RawStack<Potassco::TheoryAtom_*>::push(&this_00->atoms,&local_20);
        this_00 = this->data_;
      } while ((uint32_t)((this_00->atoms).top >> 3) != newSize);
    }
    else {
      do {
        uVar1 = uVar1 - 8;
      } while ((uint32_t)(uVar1 >> 3) != newSize);
      (this_00->atoms).top = uVar1;
    }
  }
  return;
}

Assistant:

void TheoryData::resizeAtoms(uint32_t newSize) {
	if (newSize != numAtoms()) {
		if (newSize > numAtoms()) { do { data_->atoms.push(); } while (numAtoms() != newSize); }
		else                      { do { data_->atoms.pop();  } while (numAtoms() != newSize); }
	}
}